

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_resumption_impl(int different_preferred_key_share,int require_client_authentication)

{
  ptls_key_exchange_algorithm_t **pppVar1;
  ptls_context_t *ppVar2;
  ptls_context_t *ppVar3;
  size_t sVar4;
  undefined8 uVar5;
  size_t sVar6;
  bool bVar7;
  ptls_save_ticket_t st;
  ptls_encrypt_ticket_t et;
  ptls_key_exchange_algorithm_t *different_key_exchanges [3];
  uint local_64;
  ptls_save_ticket_t local_58;
  ptls_encrypt_ticket_t local_50;
  ptls_key_exchange_algorithm_t *local_48;
  ptls_key_exchange_algorithm_t *local_40;
  undefined8 local_38;
  
  ppVar3 = ctx;
  ppVar2 = ctx_peer;
  pppVar1 = ctx->key_exchanges;
  local_40 = *pppVar1;
  if (local_40->id != (*ctx_peer->key_exchanges)->id) {
    __assert_fail("ctx->key_exchanges[0]->id == ctx_peer->key_exchanges[0]->id",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0x390,"void test_resumption_impl(int, int)");
  }
  if (pppVar1[1] != (ptls_key_exchange_algorithm_t *)0x0) {
    __assert_fail("ctx->key_exchanges[1] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0x391,"void test_resumption_impl(int, int)");
  }
  if (ctx_peer->key_exchanges[1] != (ptls_key_exchange_algorithm_t *)0x0) {
    __assert_fail("ctx_peer->key_exchanges[1] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0x392,"void test_resumption_impl(int, int)");
  }
  if (local_40->id != 0x1d) {
    local_48 = &ptls_minicrypto_x25519;
    local_38 = 0;
    if (different_preferred_key_share != 0) {
      ctx->key_exchanges = &local_48;
    }
    local_50.cb = on_copy_ticket;
    local_58.cb = on_save_ticket;
    if (ppVar2->ticket_lifetime != 0) {
      __assert_fail("ctx_peer->ticket_lifetime == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c"
                    ,0x39d,"void test_resumption_impl(int, int)");
    }
    if (ppVar2->max_early_data_size != 0) {
      __assert_fail("ctx_peer->max_early_data_size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c"
                    ,0x39e,"void test_resumption_impl(int, int)");
    }
    if (ppVar2->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
      if (ppVar2->save_ticket == (ptls_save_ticket_t *)0x0) {
        saved_ticket = (ptls_iovec_t)ZEXT816(0);
        ppVar2->ticket_lifetime = 0x15180;
        ppVar2->max_early_data_size = 0x2000;
        ppVar2->encrypt_ticket = &local_50;
        ppVar3->save_ticket = &local_58;
        sc_callcnt = 0;
        test_handshake((ptls_iovec_t)ZEXT816(0),(uint)(different_preferred_key_share != 0),1,0,0);
        _ok((uint)(sc_callcnt == 1),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x3aa)
        ;
        _ok((uint)(saved_ticket.base != (uint8_t *)0x0),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x3ab)
        ;
        test_handshake(saved_ticket,0,1,0,require_client_authentication);
        bVar7 = require_client_authentication == 1;
        _ok((uint)(sc_callcnt == (ulong)bVar7 * 2 + 1),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
            (ulong)((uint)!bVar7 * 2 + 0x3b0));
        test_handshake(saved_ticket,4,1,0,(uint)bVar7);
        _ok((uint)(sc_callcnt == (ulong)bVar7 * 4 + 1),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
            (ulong)((uint)!bVar7 * 2 + 0x3b8));
        ctx->field_0x68 = ctx->field_0x68 | 1;
        test_handshake(saved_ticket,0,1,0,require_client_authentication);
        if (require_client_authentication != 1) {
          local_64 = 0x3cc;
          uVar5 = 0x3c4;
          sVar4 = 1;
          sVar6 = 1;
        }
        else {
          local_64 = 0x3ca;
          sVar6 = 9;
          uVar5 = 0x3c2;
          sVar4 = 7;
        }
        _ok((uint)(sc_callcnt == sVar4),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",uVar5)
        ;
        test_handshake(saved_ticket,4,1,0,(uint)(require_client_authentication == 1));
        _ok((uint)(sc_callcnt == sVar6),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
            (ulong)local_64);
        ppVar3 = ctx;
        ctx->field_0x68 = ctx->field_0x68 & 0xfe;
        ppVar2 = ctx_peer;
        ppVar2->ticket_lifetime = 0;
        ppVar2->max_early_data_size = 0;
        ppVar2->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
        ppVar3->save_ticket = (ptls_save_ticket_t *)0x0;
        ppVar3->key_exchanges = pppVar1;
        return;
      }
      __assert_fail("ctx_peer->save_ticket == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c"
                    ,0x3a0,"void test_resumption_impl(int, int)");
    }
    __assert_fail("ctx_peer->encrypt_ticket == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0x39f,"void test_resumption_impl(int, int)");
  }
  __assert_fail("ctx->key_exchanges[0]->id != ptls_minicrypto_x25519.id",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                0x393,"void test_resumption_impl(int, int)");
}

Assistant:

static void test_resumption_impl(int different_preferred_key_share, int require_client_authentication)
{
    assert(ctx->key_exchanges[0]->id == ctx_peer->key_exchanges[0]->id);
    assert(ctx->key_exchanges[1] == NULL);
    assert(ctx_peer->key_exchanges[1] == NULL);
    assert(ctx->key_exchanges[0]->id != ptls_minicrypto_x25519.id);
    ptls_key_exchange_algorithm_t *different_key_exchanges[] = {&ptls_minicrypto_x25519, ctx->key_exchanges[0], NULL},
                                  **key_exchanges_orig = ctx->key_exchanges;

    if (different_preferred_key_share)
        ctx->key_exchanges = different_key_exchanges;

    ptls_encrypt_ticket_t et = {on_copy_ticket};
    ptls_save_ticket_t st = {on_save_ticket};

    assert(ctx_peer->ticket_lifetime == 0);
    assert(ctx_peer->max_early_data_size == 0);
    assert(ctx_peer->encrypt_ticket == NULL);
    assert(ctx_peer->save_ticket == NULL);
    saved_ticket = ptls_iovec_init(NULL, 0);

    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;
    ctx_peer->encrypt_ticket = &et;
    ctx->save_ticket = &st;

    sc_callcnt = 0;
    test_handshake(saved_ticket, different_preferred_key_share ? TEST_HANDSHAKE_2RTT : TEST_HANDSHAKE_1RTT, 1, 0, 0);
    ok(sc_callcnt == 1);
    ok(saved_ticket.base != NULL);

    /* psk using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_1RTT, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 3);
    } else {
        ok(sc_callcnt == 1);
    }

    /* 0-rtt psk using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_EARLY_DATA, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 5);
    } else {
        ok(sc_callcnt == 1);
    }

    ctx->require_dhe_on_psk = 1;

    /* psk-dhe using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_1RTT, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 7);
    } else {
        ok(sc_callcnt == 1);
    }

    /* 0-rtt psk-dhe using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_EARLY_DATA, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 9);
    } else {
        ok(sc_callcnt == 1);
    }

    ctx->require_dhe_on_psk = 0;
    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx->save_ticket = NULL;
    ctx->key_exchanges = key_exchanges_orig;
}